

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeEventPoolOpenIpcHandle
          (ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc,
          ze_event_pool_handle_t *phEventPool)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  long lVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  long lVar8;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar8 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeEventPoolOpenIpcHandle(hContext, hIpc, phEventPool)","");
  if (*(char *)(lVar8 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar8 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar4 + 0x478);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar8 = *(long *)(lVar4 + 0xd30);
    lVar2 = *(long *)(lVar4 + 0xd38);
    lVar6 = lVar2 - lVar8 >> 3;
    if (lVar2 != lVar8) {
      lVar7 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar7 * 8);
        result = (**(code **)(*plVar3 + 0x420))(plVar3,hContext,phEventPool);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0015239b;
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    if (((*(char *)(lVar4 + 4) != '\x01') ||
        (result = ZEHandleLifetimeValidation::zeEventPoolOpenIpcHandlePrologue
                            (*(ZEHandleLifetimeValidation **)(lVar4 + 0xd48),hContext,hIpc,
                             phEventPool), result == ZE_RESULT_SUCCESS)) &&
       (zVar5 = (*pcVar1)(hContext,phEventPool), result = zVar5, lVar2 != lVar8)) {
      lVar8 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar8 * 8);
        result = (**(code **)(*plVar3 + 0x428))
                           (plVar3,hContext,phEventPool,zVar5,in_R8,in_R9,hIpc.data._0_4_,
                            hIpc.data._8_4_,hIpc.data._16_4_,hIpc.data._24_4_,hIpc.data._32_4_,
                            hIpc.data._40_4_,hIpc.data._48_4_,hIpc.data._56_4_);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar8 = lVar8 + 1;
        result = zVar5;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
    }
  }
LAB_0015239b:
  logAndPropagateResult("zeEventPoolOpenIpcHandle",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object to associate with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc,                ///< [in] IPC event pool handle
        ze_event_pool_handle_t* phEventPool             ///< [out] pointer handle of event pool object created
        )
    {
        context.logger->log_trace("zeEventPoolOpenIpcHandle(hContext, hIpc, phEventPool)");

        auto pfnOpenIpcHandle = context.zeDdiTable.EventPool.pfnOpenIpcHandle;

        if( nullptr == pfnOpenIpcHandle )
            return logAndPropagateResult("zeEventPoolOpenIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolOpenIpcHandlePrologue( hContext, hIpc, phEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolOpenIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventPoolOpenIpcHandlePrologue( hContext, hIpc, phEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolOpenIpcHandle", result);
        }

        auto driver_result = pfnOpenIpcHandle( hContext, hIpc, phEventPool );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolOpenIpcHandleEpilogue( hContext, hIpc, phEventPool ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolOpenIpcHandle", result);
        }

        return logAndPropagateResult("zeEventPoolOpenIpcHandle", driver_result);
    }